

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O2

double mp::ComputeValue<mp::VarInfoRecomp>(LogAConstraint *con,VarInfoRecomp *x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = VarVecRecomp::operator[]
                    (&(x->super_VarInfoRecompTypedef).x_,
                     (con->
                     super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId>
                     ).args_._M_elems[0]);
  dVar1 = log(dVar1);
  dVar2 = log((con->
              super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId>)
              .params_._M_elems[0]);
  return dVar1 / dVar2;
}

Assistant:

double ComputeValue(const LogAConstraint& con, const VarVec& x) {
  return
      std::log(x[con.GetArguments()[0]])
      / std::log(con.GetParameters()[0]);
}